

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O0

float VW_Get_Weight(VW_HANDLE handle,size_t index,size_t offset)

{
  undefined8 in_RDX;
  vw *in_RSI;
  float fVar1;
  vw *pointer;
  
  fVar1 = VW::get_weight(in_RSI,(uint32_t)((ulong)in_RDX >> 0x20),(uint32_t)in_RDX);
  return fVar1;
}

Assistant:

VW_DLL_MEMBER float VW_CALLING_CONV VW_Get_Weight(VW_HANDLE handle, size_t index, size_t offset)
{ vw* pointer = static_cast<vw*>(handle);
  return VW::get_weight(*pointer, (uint32_t) index, (uint32_t) offset);
}